

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O3

ui_event object_skin_process_direction(menu_conflict *m,int dir)

{
  short sVar1;
  ulong uVar2;
  int16_t *piVar3;
  int16_t *piVar4;
  ui_event uVar5;
  
  piVar4 = ddy;
  sVar1 = ddy[dir];
  if (ddx[dir] == 0) {
    if (sVar1 == 0) goto LAB_001f6317;
    m->cursor = m->cursor + (int)sVar1;
    uVar2 = 0x20;
  }
  else {
    if (sVar1 == 0) {
      piVar4 = (int16_t *)((ulong)(-1 < ddx[dir]) << 0x20);
      piVar3 = piVar4 + 0x4080000000;
      uVar2 = 0x80;
      goto LAB_001f631b;
    }
LAB_001f6317:
    uVar2 = 0;
  }
  piVar3 = (int16_t *)0x0;
LAB_001f631b:
  uVar5._0_8_ = uVar2 | (ulong)piVar3;
  uVar5._8_4_ = SUB84(piVar4,0);
  return uVar5;
}

Assistant:

static ui_event object_skin_process_direction(struct menu *m, int dir)
{
	ui_event out = EVENT_EMPTY;

	/* Reject diagonals */
	if (ddx[dir] && ddy[dir])
		;

	/* Prepare to switch menus */
	else if (ddx[dir]) {
		out.type = EVT_SWITCH;
		out.key.code = ddx[dir] < 0 ? ARROW_LEFT : ARROW_RIGHT;
	}

	/* Move up or down to the next valid & visible row */
	else if (ddy[dir]) {
		m->cursor += ddy[dir];
		out.type = EVT_MOVE;
	}

	return out;
}